

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-tcp-connect-error-after-write.c
# Opt level: O1

int run_test_tcp_connect_error_after_write(void)

{
  int iVar1;
  int extraout_EAX;
  int iVar2;
  int extraout_EAX_00;
  undefined8 uVar3;
  undefined1 *puVar4;
  char *pcVar5;
  sockaddr_in addr;
  uv_tcp_t conn;
  uv_write_t write_req;
  uv_connect_t connect_req;
  undefined1 local_240 [16];
  undefined1 local_230 [16];
  undefined1 local_220 [248];
  char local_128 [192];
  char local_68 [96];
  
  pcVar5 = "127.0.0.1";
  iVar2 = 0x23a3;
  iVar1 = uv_ip4_addr("127.0.0.1",0x23a3,local_230);
  if (iVar1 == 0) {
    local_240 = uv_buf_init("TEST",4);
    pcVar5 = (char *)uv_default_loop();
    iVar2 = (int)local_220;
    iVar1 = uv_tcp_init();
    if (iVar1 != 0) goto LAB_00171f4e;
    pcVar5 = local_128;
    puVar4 = local_220;
    iVar1 = uv_write(pcVar5,puVar4,local_240,1,write_cb);
    iVar2 = (int)puVar4;
    if (iVar1 != -9) goto LAB_00171f53;
    pcVar5 = local_68;
    puVar4 = local_220;
    iVar1 = uv_tcp_connect(pcVar5,puVar4,local_230,connect_cb);
    iVar2 = (int)puVar4;
    if (iVar1 != 0) goto LAB_00171f58;
    pcVar5 = local_128;
    puVar4 = local_220;
    iVar1 = uv_write(pcVar5,puVar4,local_240,1,write_cb);
    iVar2 = (int)puVar4;
    if (iVar1 != 0) goto LAB_00171f5d;
    pcVar5 = (char *)uv_default_loop();
    iVar2 = 0;
    iVar1 = uv_run();
    if (iVar1 != 0) goto LAB_00171f62;
    if (connect_cb_called != 1) goto LAB_00171f67;
    if (write_cb_called != 1) goto LAB_00171f6c;
    if (close_cb_called == 1) {
      uVar3 = uv_default_loop();
      uv_walk(uVar3,close_walk_cb,0);
      iVar2 = 0;
      uv_run(uVar3);
      pcVar5 = (char *)uv_default_loop();
      iVar1 = uv_loop_close();
      if (iVar1 == 0) {
        return 0;
      }
      goto LAB_00171f76;
    }
  }
  else {
    run_test_tcp_connect_error_after_write_cold_1();
LAB_00171f4e:
    run_test_tcp_connect_error_after_write_cold_2();
LAB_00171f53:
    run_test_tcp_connect_error_after_write_cold_3();
LAB_00171f58:
    run_test_tcp_connect_error_after_write_cold_4();
LAB_00171f5d:
    run_test_tcp_connect_error_after_write_cold_5();
LAB_00171f62:
    run_test_tcp_connect_error_after_write_cold_6();
LAB_00171f67:
    run_test_tcp_connect_error_after_write_cold_7();
LAB_00171f6c:
    run_test_tcp_connect_error_after_write_cold_8();
  }
  run_test_tcp_connect_error_after_write_cold_9();
LAB_00171f76:
  run_test_tcp_connect_error_after_write_cold_10();
  if (iVar2 < 0) {
    write_cb_called = write_cb_called + 1;
    return extraout_EAX;
  }
  write_cb_cold_1();
  if (iVar2 < 0) {
    connect_cb_called = connect_cb_called + 1;
    iVar2 = uv_close(*(undefined8 *)(pcVar5 + 0x48),close_cb);
    return iVar2;
  }
  connect_cb_cold_1();
  close_cb_called = close_cb_called + 1;
  return extraout_EAX_00;
}

Assistant:

TEST_IMPL(tcp_connect_error_after_write) {
  uv_connect_t connect_req;
  struct sockaddr_in addr;
  uv_write_t write_req;
  uv_tcp_t conn;
  uv_buf_t buf;
  int r;

#ifdef _WIN32
  fprintf(stderr, "This test is disabled on Windows for now.\n");
  fprintf(stderr, "See https://github.com/joyent/libuv/issues/444\n");
  return 0; /* windows slackers... */
#endif

  ASSERT(0 == uv_ip4_addr("127.0.0.1", TEST_PORT, &addr));
  buf = uv_buf_init("TEST", 4);

  r = uv_tcp_init(uv_default_loop(), &conn);
  ASSERT(r == 0);

  r = uv_write(&write_req, (uv_stream_t*)&conn, &buf, 1, write_cb);
  ASSERT(r == UV_EBADF);

  r = uv_tcp_connect(&connect_req,
                     &conn,
                     (const struct sockaddr*) &addr,
                     connect_cb);
  ASSERT(r == 0);

  r = uv_write(&write_req, (uv_stream_t*)&conn, &buf, 1, write_cb);
  ASSERT(r == 0);

  r = uv_run(uv_default_loop(), UV_RUN_DEFAULT);
  ASSERT(r == 0);

  ASSERT(connect_cb_called == 1);
  ASSERT(write_cb_called == 1);
  ASSERT(close_cb_called == 1);

  MAKE_VALGRIND_HAPPY();
  return 0;
}